

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

FStateDefine *
FStateDefinitions::FindStateLabelInList
          (TArray<FStateDefine,_FStateDefine> *list,FName *name,bool create)

{
  uint uVar1;
  ulong uVar2;
  FStateDefine *pFVar3;
  FStateDefine local_40;
  
  uVar2 = (ulong)list->Count;
  if (uVar2 != 0) {
    pFVar3 = list->Array;
    do {
      if ((pFVar3->Label).Index == name->Index) {
        return pFVar3;
      }
      pFVar3 = pFVar3 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  if (create) {
    local_40.Children.Array = (FStateDefine *)0x0;
    local_40.Children.Most = 0;
    local_40.Children.Count = 0;
    local_40.Label = (FName)name->Index;
    local_40.State = (FState *)0x0;
    local_40.DefineFlags = '\0';
    uVar1 = TArray<FStateDefine,_FStateDefine>::Push(list,&local_40);
    pFVar3 = list->Array + uVar1;
    TArray<FStateDefine,_FStateDefine>::~TArray(&local_40.Children);
  }
  else {
    pFVar3 = (FStateDefine *)0x0;
  }
  return pFVar3;
}

Assistant:

FStateDefine *FStateDefinitions::FindStateLabelInList(TArray<FStateDefine> & list, FName name, bool create)
{
	for(unsigned i = 0; i<list.Size(); i++)
	{
		if (list[i].Label == name)
		{
			return &list[i];
		}
	}
	if (create)
	{
		FStateDefine def;
		def.Label = name;
		def.State = NULL;
		def.DefineFlags = SDF_NEXT;
		return &list[list.Push(def)];
	}
	return NULL;
}